

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataset.cpp
# Opt level: O1

vector<Matrix<double>,_std::allocator<Matrix<double>_>_> * __thiscall
DataSet::compile(vector<Matrix<double>,_std::allocator<Matrix<double>_>_> *__return_storage_ptr__,
                DataSet *this,uint n_output)

{
  uint end_col;
  Matrix<double> *__cur;
  pointer pMVar1;
  Matrix<double> local_90;
  
  (__return_storage_ptr__->super__Vector_base<Matrix<double>,_std::allocator<Matrix<double>_>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Matrix<double>,_std::allocator<Matrix<double>_>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Matrix<double>,_std::allocator<Matrix<double>_>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pMVar1 = (pointer)operator_new(0xc0);
  (__return_storage_ptr__->super__Vector_base<Matrix<double>,_std::allocator<Matrix<double>_>_>).
  _M_impl.super__Vector_impl_data._M_start = pMVar1;
  (__return_storage_ptr__->super__Vector_base<Matrix<double>,_std::allocator<Matrix<double>_>_>).
  _M_impl.super__Vector_impl_data._M_finish = pMVar1;
  (__return_storage_ptr__->super__Vector_base<Matrix<double>,_std::allocator<Matrix<double>_>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = pMVar1 + 2;
  memset(pMVar1,0,0xc0);
  (__return_storage_ptr__->super__Vector_base<Matrix<double>,_std::allocator<Matrix<double>_>_>).
  _M_impl.super__Vector_impl_data._M_finish = pMVar1 + 2;
  Matrix<double>::compile(&local_90,&this->m_matrix,0,(this->m_matrix).m_shape.n_col - n_output);
  pMVar1 = (__return_storage_ptr__->
           super__Vector_base<Matrix<double>,_std::allocator<Matrix<double>_>_>)._M_impl.
           super__Vector_impl_data._M_start;
  (pMVar1->m_shape).is_diogonal = local_90.m_shape.is_diogonal;
  (pMVar1->m_shape).n_row = local_90.m_shape.n_row;
  (pMVar1->m_shape).n_col = local_90.m_shape.n_col;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::operator=(&pMVar1->m_elems,&local_90.m_elems);
  pMVar1->m_functions[6] = local_90.m_functions[6];
  pMVar1->m_functions[4] = local_90.m_functions[4];
  pMVar1->m_functions[5] = local_90.m_functions[5];
  pMVar1->m_functions[2] = local_90.m_functions[2];
  pMVar1->m_functions[3] = local_90.m_functions[3];
  pMVar1->m_functions[0] = local_90.m_functions[0];
  pMVar1->m_functions[1] = local_90.m_functions[1];
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_90.m_elems);
  end_col = (this->m_matrix).m_shape.n_col;
  Matrix<double>::compile(&local_90,&this->m_matrix,end_col - n_output,end_col);
  pMVar1 = (__return_storage_ptr__->
           super__Vector_base<Matrix<double>,_std::allocator<Matrix<double>_>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pMVar1[1].m_shape.is_diogonal = local_90.m_shape.is_diogonal;
  pMVar1[1].m_shape.n_row = local_90.m_shape.n_row;
  pMVar1[1].m_shape.n_col = local_90.m_shape.n_col;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::operator=(&pMVar1[1].m_elems,&local_90.m_elems);
  pMVar1[1].m_functions[6] = local_90.m_functions[6];
  pMVar1[1].m_functions[4] = local_90.m_functions[4];
  pMVar1[1].m_functions[5] = local_90.m_functions[5];
  pMVar1[1].m_functions[2] = local_90.m_functions[2];
  pMVar1[1].m_functions[3] = local_90.m_functions[3];
  pMVar1[1].m_functions[0] = local_90.m_functions[0];
  pMVar1[1].m_functions[1] = local_90.m_functions[1];
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_90.m_elems);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Matrix_d> DataSet::compile(unsigned n_output) const{
    std::vector<Matrix_d> matrices(2);
    
    matrices[0]=m_matrix.compile(0, m_matrix.shape().n_col-n_output);
    matrices[1]=m_matrix.compile(m_matrix.shape().n_col-n_output, m_matrix.shape().n_col);

    return matrices;
}